

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O2

bool __thiscall Func::IsStackArgOptDisabled(Func *this)

{
  bool bVar1;
  JITTimeProfileInfo *this_00;
  
  bVar1 = HasProfileInfo(this);
  if (bVar1) {
    this_00 = GetReadOnlyProfileInfo(this);
    bVar1 = JITTimeProfileInfo::IsStackArgOptDisabled(this_00);
    if (bVar1) {
      return true;
    }
  }
  bVar1 = JITOutput::IsStackArgOptDisabled(&this->m_output);
  return bVar1;
}

Assistant:

bool
Func::IsStackArgOptDisabled() const
{
    return (HasProfileInfo() && GetReadOnlyProfileInfo()->IsStackArgOptDisabled()) || m_output.IsStackArgOptDisabled();
}